

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O2

bool __thiscall HSet::debug(HSet *this)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  FILE *pFVar10;
  
  if (this->setup_ == false) {
    if (this->output_flag_ == true) {
      fwrite("HSet: ERROR setup_ not called\n",0x1e,1,(FILE *)this->log_file_);
    }
  }
  else {
    uVar8 = (ulong)this->max_entry_;
    if ((long)uVar8 < 0) {
      if (this->output_flag_ != true) {
        return false;
      }
      pFVar10 = (FILE *)this->log_file_;
      pcVar9 = "HSet: ERROR max_entry_ = %d < %d\n";
      uVar6 = 0;
      uVar4 = uVar8;
    }
    else {
      piVar3 = (this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = (ulong)((long)(this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
      uVar1 = this->count_;
      uVar6 = (ulong)uVar1;
      if ((int)uVar4 < (int)uVar1) {
        if (this->output_flag_ != true) {
          return false;
        }
        pFVar10 = (FILE *)this->log_file_;
        pcVar9 = "HSet: ERROR entry_.size() = %d is less than count_ = %d\n";
        uVar4 = uVar4 & 0xffffffff;
      }
      else {
        uVar4 = 0;
        for (uVar5 = 0; uVar5 <= uVar8; uVar5 = uVar5 + 1) {
          uVar2 = (this->pointer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5];
          uVar7 = (ulong)uVar2;
          if (uVar7 != 0xffffffff) {
            if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) {
              if (this->output_flag_ != true) {
                return false;
              }
              pFVar10 = (FILE *)this->log_file_;
              pcVar9 = "HSet: ERROR pointer_[%d] = %d is not in [0, %d]\n";
              uVar8 = uVar5 & 0xffffffff;
            }
            else {
              uVar7 = (ulong)(uint)piVar3[uVar7];
              if (uVar5 == uVar7) {
                uVar4 = (ulong)((uint)uVar4 + 1);
                goto LAB_00366e99;
              }
              if (this->output_flag_ != true) {
                return false;
              }
              pFVar10 = (FILE *)this->log_file_;
              pcVar9 = "HSet: ERROR entry_[%d] is %d, not %d\n";
              uVar8 = (ulong)uVar2;
              uVar6 = uVar5 & 0xffffffff;
            }
            fprintf(pFVar10,pcVar9,uVar8,uVar7,uVar6);
            goto LAB_00366e5b;
          }
LAB_00366e99:
        }
        if ((uint)uVar4 == uVar1) {
          return true;
        }
        if (this->output_flag_ != true) {
          return false;
        }
        pFVar10 = (FILE *)this->log_file_;
        pcVar9 = "HSet: ERROR pointer_ has %d pointers, not %d\n";
      }
    }
    fprintf(pFVar10,pcVar9,uVar4,uVar6);
LAB_00366e5b:
    print(this);
  }
  return false;
}

Assistant:

bool HSet::debug() const {
  if (!setup_) {
    if (output_flag_) fprintf(log_file_, "HSet: ERROR setup_ not called\n");
    if (allow_assert_) assert(setup_);
    return false;
  }
  bool max_entry_ok = max_entry_ >= min_entry;
  if (!max_entry_ok) {
    if (output_flag_) {
      fprintf(log_file_,
              "HSet: ERROR max_entry_ = %" HIGHSINT_FORMAT
              " < %" HIGHSINT_FORMAT "\n",
              max_entry_, min_entry);
      print();
    }
    if (allow_assert_) assert(max_entry_ok);
    return false;
  }
  HighsInt size = entry_.size();
  bool size_count_ok = size >= count_;
  if (!size_count_ok) {
    if (output_flag_) {
      fprintf(log_file_,
              "HSet: ERROR entry_.size() = %" HIGHSINT_FORMAT
              " is less than count_ = %" HIGHSINT_FORMAT "\n",
              size, count_);
      print();
    }
    if (allow_assert_) assert(size_count_ok);
    return false;
  }
  // Check pointer_ is consistent with count_ and entry_
  HighsInt count = 0;
  for (HighsInt ix = 0; ix <= max_entry_; ix++) {
    HighsInt pointer = pointer_[ix];
    if (pointer == no_pointer) continue;
    bool pointer_ok = pointer >= 0 && pointer < count_;
    if (!pointer_ok) {
      if (output_flag_) {
        fprintf(log_file_,
                "HSet: ERROR pointer_[%" HIGHSINT_FORMAT "] = %" HIGHSINT_FORMAT
                " is not in [0, %" HIGHSINT_FORMAT "]\n",
                ix, pointer, count_);
        print();
      }
      if (allow_assert_) assert(pointer_ok);
      return false;
    }
    count++;
    HighsInt entry = entry_[pointer];
    bool entry_ok = entry == ix;
    if (!entry_ok) {
      if (output_flag_) {
        fprintf(log_file_,
                "HSet: ERROR entry_[%" HIGHSINT_FORMAT "] is %" HIGHSINT_FORMAT
                ", not %" HIGHSINT_FORMAT "\n",
                pointer, entry, ix);
        print();
      }
      if (allow_assert_) assert(entry_ok);
      return false;
    }
  }
  bool count_ok = count == count_;
  if (!count_ok) {
    if (output_flag_) {
      fprintf(log_file_,
              "HSet: ERROR pointer_ has %" HIGHSINT_FORMAT
              " pointers, not %" HIGHSINT_FORMAT "\n",
              count, count_);
      print();
    }
    if (allow_assert_) assert(count_ok);
    return false;
  }
  return true;
}